

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tftp.c
# Opt level: O2

CURLcode tftp_state_machine(tftp_state_data *state,tftp_event_t event)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Curl_easy *data;
  uchar *puVar4;
  curl_trc_feat *pcVar5;
  long lVar6;
  Curl_sockaddr_ex *pCVar7;
  char *pcVar8;
  CURLcode CVar9;
  size_t sVar10;
  size_t sVar11;
  int *piVar12;
  long lVar13;
  tftp_event_t event_00;
  char *pcVar14;
  size_t sVar15;
  size_t sbytes;
  char *filename;
  char buf [64];
  
  data = state->data;
  switch(state->state) {
  case TFTP_STATE_START:
    uVar1 = *(uint *)&(data->state).field_0x774;
    pcVar14 = "netascii";
    if ((uVar1 >> 0xc & 1) == 0) {
      pcVar14 = "octet";
    }
    break;
  case TFTP_STATE_RX:
    CVar9 = tftp_rx(state,event);
    return CVar9;
  case TFTP_STATE_TX:
    CVar9 = tftp_tx(state,event);
    return CVar9;
  case TFTP_STATE_FIN:
    if (data == (Curl_easy *)0x0) {
      return CURLE_OK;
    }
    if (((data->set).field_0x8cd & 0x10) != 0) {
      pcVar5 = (data->state).feat;
      if ((pcVar5 != (curl_trc_feat *)0x0) && (pcVar5->log_level < 1)) {
        return CURLE_OK;
      }
      Curl_infof(data,"%s","TFTP finished");
      return CURLE_OK;
    }
    return CURLE_OK;
  default:
    Curl_failf(data,"%s","Internal state machine error");
    return CURLE_TFTP_ILLEGAL;
  }
  switch(event) {
  case TFTP_EVENT_INIT:
  case TFTP_EVENT_TIMEOUT:
    iVar2 = state->retries;
    state->retries = iVar2 + 1;
    if (iVar2 < state->retry_max) {
      uVar3 = *(uint *)&(data->state).field_0x774;
      *(state->spacket).data = '\0';
      puVar4 = (state->spacket).data;
      if ((uVar3 >> 0x11 & 1) == 0) {
        puVar4[1] = '\x01';
      }
      else {
        puVar4[1] = '\x02';
        lVar6 = (data->state).infilesize;
        if (lVar6 != -1) {
          Curl_pgrsSetUploadSize(data,lVar6);
        }
      }
      CVar9 = Curl_urldecode((state->data->state).up.path + 1,0,&filename,(size_t *)0x0,REJECT_ZERO)
      ;
      pcVar8 = filename;
      if (CVar9 != CURLE_OK) {
        return CVar9;
      }
      sVar10 = strlen(filename);
      if (((ulong)((uint)((uVar1 >> 0xc & 1) == 0) * 3) | 0xfffffffffffffff4) + (long)state->blksize
          < sVar10) {
        pcVar14 = "TFTP filename too long";
        goto LAB_001572c2;
      }
      curl_msnprintf((char *)((state->spacket).data + 2),(long)state->blksize,"%s%c%s%c",pcVar8,0,
                     pcVar14,0);
      sVar10 = strlen(filename);
      sVar15 = sVar10 + (ulong)(uVar1 >> 0xc & 1) * 3 + 9;
      sbytes = sVar15;
      if (((data->set).field_0x8ca & 4) != 0) {
LAB_0015736b:
        sVar15 = sbytes;
        pCVar7 = data->conn->remote_addr;
        sVar11 = sendto(state->sockfd,(state->spacket).data,sbytes,0,
                        (sockaddr *)&(pCVar7->_sa_ex_u).addr,pCVar7->addrlen);
        if (sVar11 != sVar15) {
          piVar12 = __errno_location();
          pcVar14 = Curl_strerror(*piVar12,buf,0x100);
          Curl_failf(data,"%s",pcVar14);
        }
        (*Curl_cfree)(filename);
        return CURLE_OK;
      }
      if (((data->state).field_0x776 & 2) == 0) {
        lVar13 = 0;
      }
      else {
        lVar6 = (data->state).infilesize;
        lVar13 = 0;
        if (lVar6 != -1) {
          lVar13 = lVar6;
        }
      }
      curl_msnprintf(buf,0x40,"%ld",lVar13);
      CVar9 = tftp_option_add(state,&sbytes,(char *)((state->spacket).data + sVar15),"tsize");
      if (CVar9 == CURLE_OK) {
        CVar9 = tftp_option_add(state,&sbytes,(char *)((state->spacket).data + sbytes),buf);
        curl_msnprintf(buf,0x40,"%d",(ulong)(uint)state->requested_blksize);
        if ((CVar9 != CURLE_OK) ||
           (CVar9 = tftp_option_add(state,&sbytes,(char *)((state->spacket).data + sbytes),"blksize"
                                   ), CVar9 != CURLE_OK)) goto LAB_001572a1;
        CVar9 = tftp_option_add(state,&sbytes,(char *)((state->spacket).data + sbytes),buf);
        curl_msnprintf(buf,0x40,"%d",(ulong)(uint)state->retry_time);
        if ((CVar9 == CURLE_OK) &&
           ((CVar9 = tftp_option_add(state,&sbytes,(char *)((state->spacket).data + sbytes),
                                     "timeout"), CVar9 == CURLE_OK &&
            (CVar9 = tftp_option_add(state,&sbytes,(char *)((state->spacket).data + sbytes),buf),
            CVar9 == CURLE_OK)))) goto LAB_0015736b;
      }
      else {
        curl_msnprintf(buf,0x40,"%d",(ulong)(uint)state->requested_blksize);
LAB_001572a1:
        curl_msnprintf(buf,0x40,"%d",(ulong)(uint)state->retry_time);
      }
      pcVar14 = "TFTP buffer too small for options";
LAB_001572c2:
      Curl_failf(data,pcVar14);
      (*Curl_cfree)(filename);
      return CURLE_TFTP_ILLEGAL;
    }
    state->error = TFTP_ERR_NORESPONSE;
  case TFTP_EVENT_ERROR:
    state->state = TFTP_STATE_FIN;
    CVar9 = CURLE_OK;
    break;
  default:
    Curl_failf(data,"tftp_send_first: internal error");
    return CURLE_OK;
  case TFTP_EVENT_DATA:
    event_00 = TFTP_EVENT_DATA;
    goto LAB_001570c8;
  case TFTP_EVENT_ACK:
    event_00 = TFTP_EVENT_ACK;
LAB_001570d5:
    CVar9 = tftp_connect_for_tx(state,event_00);
    return CVar9;
  case TFTP_EVENT_OACK:
    event_00 = TFTP_EVENT_OACK;
    if ((uVar1 >> 0x11 & 1) != 0) goto LAB_001570d5;
LAB_001570c8:
    CVar9 = tftp_connect_for_rx(state,event_00);
  }
  return CVar9;
}

Assistant:

static CURLcode tftp_state_machine(struct tftp_state_data *state,
                                   tftp_event_t event)
{
  CURLcode result = CURLE_OK;
  struct Curl_easy *data = state->data;

  switch(state->state) {
  case TFTP_STATE_START:
    DEBUGF(infof(data, "TFTP_STATE_START"));
    result = tftp_send_first(state, event);
    break;
  case TFTP_STATE_RX:
    DEBUGF(infof(data, "TFTP_STATE_RX"));
    result = tftp_rx(state, event);
    break;
  case TFTP_STATE_TX:
    DEBUGF(infof(data, "TFTP_STATE_TX"));
    result = tftp_tx(state, event);
    break;
  case TFTP_STATE_FIN:
    infof(data, "%s", "TFTP finished");
    break;
  default:
    DEBUGF(infof(data, "STATE: %d", state->state));
    failf(data, "%s", "Internal state machine error");
    result = CURLE_TFTP_ILLEGAL;
    break;
  }

  return result;
}